

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O2

void lowbd_fwd_txfm2d_32x16_avx2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  code *pcVar1;
  code *pcVar2;
  int8_t *piVar3;
  undefined7 in_register_00000009;
  ulong uVar4;
  long lVar5;
  __m256i *out;
  __m256i buf1 [64];
  __m256i buf0 [32];
  longlong local_c60 [256];
  longlong local_460 [134];
  
  piVar3 = av1_fwd_txfm_shift_ls[10];
  uVar4 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_type) << 3);
  pcVar1 = *(code **)((long)col_txfm16x16_arr + uVar4);
  pcVar2 = *(code **)((long)row_txfm16x32_arr + uVar4);
  out = (__m256i *)local_460;
  for (lVar5 = 0; lVar5 != 0x400; lVar5 = lVar5 + 0x200) {
    if ((0xbeafU >> (tx_type & 0x1f) & 1) == 0 && tx_type < 0x10) {
      load_buffer_16bit_to_16bit_flip_avx2(input,stride,out,0x10);
    }
    else {
      load_buffer_16bit_to_16bit_avx2(input,stride,out,0x10);
    }
    round_shift_16bit_w16_avx2(out,0x10,(int)*piVar3);
    (*pcVar1)(out,out,0xd);
    round_shift_16bit_w16_avx2(out,0x10,(int)piVar3[1]);
    transpose_16bit_16x16_avx2(out,(__m256i *)((long)local_c60 + lVar5));
    input = input + 0x10;
  }
  if ((0x7f1fU >> (tx_type & 0x1f) & 1) == 0 && tx_type < 0x10) {
    flip_buf_avx2((__m256i *)local_c60,out,0x20);
  }
  else {
    out = (__m256i *)local_c60;
  }
  (*pcVar2)(out,out,0xd);
  round_shift_16bit_w16_avx2(out,0x20,(int)piVar3[2]);
  store_rect_buffer_16bit_to_32bit_w16_avx2(out,output,0x10,0x20);
  return;
}

Assistant:

static void lowbd_fwd_txfm2d_32x16_avx2(const int16_t *input, int32_t *output,
                                        int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m256i buf0[32], buf1[64];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_32X16];
  const int txw_idx = get_txw_idx(TX_32X16);
  const int txh_idx = get_txh_idx(TX_32X16);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = 32;
  const int height = 16;
  const transform_1d_avx2 col_txfm = col_txfm16x16_arr[tx_type];
  const transform_1d_avx2 row_txfm = row_txfm16x32_arr[tx_type];

  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  for (int i = 0; i < 2; i++) {
    if (ud_flip) {
      load_buffer_16bit_to_16bit_flip_avx2(input + 16 * i, stride, buf0,
                                           height);
    } else {
      load_buffer_16bit_to_16bit_avx2(input + 16 * i, stride, buf0, height);
    }
    round_shift_16bit_w16_avx2(buf0, height, shift[0]);
    col_txfm(buf0, buf0, cos_bit_col);
    round_shift_16bit_w16_avx2(buf0, height, shift[1]);
    transpose_16bit_16x16_avx2(buf0, buf1 + 0 * width + 16 * i);
  }

  __m256i *buf;
  if (lr_flip) {
    buf = buf0;
    flip_buf_avx2(buf1, buf, width);
  } else {
    buf = buf1;
  }
  row_txfm(buf, buf, cos_bit_row);
  round_shift_16bit_w16_avx2(buf, width, shift[2]);
  store_rect_buffer_16bit_to_32bit_w16_avx2(buf, output, height, width);
}